

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-decimal128.c
# Opt level: O0

void test_decimal128_to_string__scientific(void)

{
  int iVar1;
  undefined8 local_e8;
  bson_decimal128_t trailing_zero_no_decimal;
  bson_decimal128_t move_decimal_after;
  bson_decimal128_t move_decimal;
  bson_decimal128_t one_trailing_zero;
  bson_decimal128_t trailing_zero;
  bson_decimal128_t tiniest;
  bson_decimal128_t largest;
  bson_decimal128_t large;
  bson_decimal128_t neg_tiny;
  bson_decimal128_t tiny;
  bson_decimal128_t huge;
  char bid_string [43];
  
  huge.low = 0x5ffe314dc6448d93;
  tiny.high = 0x38c15b0a00000000;
  tiny.low = 0;
  neg_tiny.high = 1;
  neg_tiny.low = 0x8000000000000000;
  large.high = 1;
  large.low = 0x3108000000000000;
  largest.high = 0x9184db63eb1;
  largest.low = 0x5fffed09bead87c0;
  tiniest.high = 0x378d8e63ffffffff;
  tiniest.low = 0x1ed09bead87c0;
  trailing_zero.high = 0x378d8e63ffffffff;
  trailing_zero.low = 0x304c000000000000;
  one_trailing_zero.high = 0x41a;
  one_trailing_zero.low = 0x3042000000000000;
  move_decimal.high = 0x41a;
  move_decimal.low = 0x3040000000000000;
  move_decimal_after.high = 0x69;
  move_decimal_after.low = 0x3042000000000000;
  trailing_zero_no_decimal.high = 0x69;
  trailing_zero_no_decimal.low = 0x3046000000000000;
  local_e8 = 1;
  bson_decimal128_to_string(&tiny.high,&huge.high);
  iVar1 = strcmp("1.000000000000000000000000000000000E+6144",(char *)&huge.high);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0xce,"test_decimal128_to_string__scientific",
            "!strcmp (\"1.000000000000000000000000000000000E+6144\", bid_string)");
    abort();
  }
  bson_decimal128_to_string(&neg_tiny.high,&huge.high);
  iVar1 = strcmp("1E-6176",(char *)&huge.high);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0xd1,"test_decimal128_to_string__scientific","!strcmp (\"1E-6176\", bid_string)");
    abort();
  }
  bson_decimal128_to_string(&large.high,&huge.high);
  iVar1 = strcmp("-1E-6176",(char *)&huge.high);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0xd4,"test_decimal128_to_string__scientific","!strcmp (\"-1E-6176\", bid_string)");
    abort();
  }
  bson_decimal128_to_string(&large.high,&huge.high);
  iVar1 = strcmp("-1E-6176",(char *)&huge.high);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0xd7,"test_decimal128_to_string__scientific","!strcmp (\"-1E-6176\", bid_string)");
    abort();
  }
  bson_decimal128_to_string(&largest.high,&huge.high);
  iVar1 = strcmp("9.999987654321E+112",(char *)&huge.high);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0xda,"test_decimal128_to_string__scientific",
            "!strcmp (\"9.999987654321E+112\", bid_string)");
    abort();
  }
  bson_decimal128_to_string(&tiniest.high,&huge.high);
  iVar1 = strcmp("9.999999999999999999999999999999999E+6144",(char *)&huge.high);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0xdd,"test_decimal128_to_string__scientific",
            "!strcmp (\"9.999999999999999999999999999999999E+6144\", bid_string)");
    abort();
  }
  bson_decimal128_to_string(&trailing_zero.high,&huge.high);
  iVar1 = strcmp("9.999999999999999999999999999999999E-6143",(char *)&huge.high);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0xe0,"test_decimal128_to_string__scientific",
            "!strcmp (\"9.999999999999999999999999999999999E-6143\", bid_string)");
    abort();
  }
  bson_decimal128_to_string(&one_trailing_zero.high,&huge.high);
  iVar1 = strcmp("1.050E+9",(char *)&huge.high);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0xe3,"test_decimal128_to_string__scientific","!strcmp (\"1.050E+9\", bid_string)");
    abort();
  }
  bson_decimal128_to_string(&move_decimal.high,&huge.high);
  iVar1 = strcmp("1.050E+4",(char *)&huge.high);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0xe6,"test_decimal128_to_string__scientific","!strcmp (\"1.050E+4\", bid_string)");
    abort();
  }
  bson_decimal128_to_string(&move_decimal_after.high,&huge.high);
  iVar1 = strcmp("105",(char *)&huge.high);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0xe9,"test_decimal128_to_string__scientific","!strcmp (\"105\", bid_string)");
    abort();
  }
  bson_decimal128_to_string(&trailing_zero_no_decimal.high,&huge.high);
  iVar1 = strcmp("1.05E+3",(char *)&huge.high);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0xec,"test_decimal128_to_string__scientific","!strcmp (\"1.05E+3\", bid_string)");
    abort();
  }
  bson_decimal128_to_string(&local_e8,&huge.high);
  iVar1 = strcmp("1E+3",(char *)&huge.high);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0xef,"test_decimal128_to_string__scientific","!strcmp (\"1E+3\", bid_string)");
    abort();
  }
  return;
}

Assistant:

static void
test_decimal128_to_string__scientific (void)
{
   char bid_string[BSON_DECIMAL128_STRING];

   bson_decimal128_t huge;     /* 1.000000000000000000000000000000000E+6144 */
   bson_decimal128_t tiny;     /* 1E-6176 */
   bson_decimal128_t neg_tiny; /* -1E-6176 */
   bson_decimal128_t large;    /* 9.999987654321E+112 */
   bson_decimal128_t largest;  /* 9.999999999999999999999999999999999E+6144 */
   bson_decimal128_t tiniest;  /* 9.999999999999999999999999999999999E-6143 */
   bson_decimal128_t trailing_zero;            /* 1.050E9 */
   bson_decimal128_t one_trailing_zero;        /* 1.050E4 */
   bson_decimal128_t move_decimal;             /* 105 */
   bson_decimal128_t move_decimal_after;       /* 1.05E3 */
   bson_decimal128_t trailing_zero_no_decimal; /* 1E3 */

   DECIMAL128_FROM_ULLS (huge, 0x5ffe314dc6448d93, 0x38c15b0a00000000);
   DECIMAL128_FROM_ULLS (tiny, 0x0000000000000000, 0x0000000000000001);
   DECIMAL128_FROM_ULLS (neg_tiny, 0x8000000000000000, 0x0000000000000001);
   DECIMAL128_FROM_ULLS (large, 0x3108000000000000, 0x000009184db63eb1);
   DECIMAL128_FROM_ULLS (largest, 0x5fffed09bead87c0, 0x378d8e63ffffffff);
   DECIMAL128_FROM_ULLS (tiniest, 0x0001ed09bead87c0, 0x378d8e63ffffffff);
   DECIMAL128_FROM_ULLS (trailing_zero, 0x304c000000000000, 0x000000000000041a);
   DECIMAL128_FROM_ULLS (
      one_trailing_zero, 0x3042000000000000, 0x000000000000041a);
   DECIMAL128_FROM_ULLS (move_decimal, 0x3040000000000000, 0x0000000000000069);
   DECIMAL128_FROM_ULLS (
      move_decimal_after, 0x3042000000000000, 0x0000000000000069);
   DECIMAL128_FROM_ULLS (
      trailing_zero_no_decimal, 0x3046000000000000, 0x0000000000000001);

   bson_decimal128_to_string (&huge, bid_string);
   BSON_ASSERT (!strcmp ("1.000000000000000000000000000000000E+6144", bid_string));

   bson_decimal128_to_string (&tiny, bid_string);
   BSON_ASSERT (!strcmp ("1E-6176", bid_string));

   bson_decimal128_to_string (&neg_tiny, bid_string);
   BSON_ASSERT (!strcmp ("-1E-6176", bid_string));

   bson_decimal128_to_string (&neg_tiny, bid_string);
   BSON_ASSERT (!strcmp ("-1E-6176", bid_string));

   bson_decimal128_to_string (&large, bid_string);
   BSON_ASSERT (!strcmp ("9.999987654321E+112", bid_string));

   bson_decimal128_to_string (&largest, bid_string);
   BSON_ASSERT (!strcmp ("9.999999999999999999999999999999999E+6144", bid_string));

   bson_decimal128_to_string (&tiniest, bid_string);
   BSON_ASSERT (!strcmp ("9.999999999999999999999999999999999E-6143", bid_string));

   bson_decimal128_to_string (&trailing_zero, bid_string);
   BSON_ASSERT (!strcmp ("1.050E+9", bid_string));

   bson_decimal128_to_string (&one_trailing_zero, bid_string);
   BSON_ASSERT (!strcmp ("1.050E+4", bid_string));

   bson_decimal128_to_string (&move_decimal, bid_string);
   BSON_ASSERT (!strcmp ("105", bid_string));

   bson_decimal128_to_string (&move_decimal_after, bid_string);
   BSON_ASSERT (!strcmp ("1.05E+3", bid_string));

   bson_decimal128_to_string (&trailing_zero_no_decimal, bid_string);
   BSON_ASSERT (!strcmp ("1E+3", bid_string));
}